

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Bool FT_Get_Paint(FT_Face face,FT_OpaquePaint opaque_paint,FT_COLR_Paint *paint)

{
  SFNT_Service sfnt;
  TT_Face_conflict ttface;
  FT_COLR_Paint *paint_local;
  FT_Face face_local;
  FT_OpaquePaint opaque_paint_local;
  
  if ((face == (FT_Face)0x0) || (paint == (FT_COLR_Paint *)0x0)) {
    opaque_paint_local._15_1_ = 0;
  }
  else if ((face->face_flags & 8U) == 0) {
    opaque_paint_local._15_1_ = 0;
  }
  else if (*(long *)(*(long *)&face[3].units_per_EM + 0x130) == 0) {
    opaque_paint_local._15_1_ = 0;
  }
  else {
    opaque_paint_local._15_1_ =
         (**(code **)(*(long *)&face[3].units_per_EM + 0x130))
                   (face,opaque_paint.p,opaque_paint.insert_root_transform,paint);
  }
  return opaque_paint_local._15_1_;
}

Assistant:

FT_EXPORT_DEF( FT_Bool )
  FT_Get_Paint( FT_Face face,
                FT_OpaquePaint  opaque_paint,
                FT_COLR_Paint*  paint )
  {
    TT_Face       ttface;
    SFNT_Service  sfnt;


    if ( !face || !paint )
      return 0;

    if ( !FT_IS_SFNT( face ) )
      return 0;

    ttface = (TT_Face)face;
    sfnt   = (SFNT_Service)ttface->sfnt;

    if ( sfnt->get_paint )
      return sfnt->get_paint( ttface, opaque_paint, paint );
    else
      return 0;
  }